

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_update_ret(mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t add_len)

{
  int local_5c;
  uchar local_58 [4];
  int ret;
  uchar add_input [48];
  size_t add_len_local;
  uchar *additional_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  if (add_len == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    add_input._40_8_ = add_len;
    local_5c = block_cipher_df(local_58,additional,add_len);
    if (local_5c == 0) {
      local_5c = ctr_drbg_update_internal(ctx,local_58);
    }
    mbedtls_platform_zeroize(local_58,0x30);
    ctx_local._4_4_ = local_5c;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ctr_drbg_update_ret( mbedtls_ctr_drbg_context *ctx,
                                 const unsigned char *additional,
                                 size_t add_len )
{
    unsigned char add_input[MBEDTLS_CTR_DRBG_SEEDLEN];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( add_len == 0 )
        return( 0 );

    if( ( ret = block_cipher_df( add_input, additional, add_len ) ) != 0 )
        goto exit;
    if( ( ret = ctr_drbg_update_internal( ctx, add_input ) ) != 0 )
        goto exit;

exit:
    mbedtls_platform_zeroize( add_input, sizeof( add_input ) );
    return( ret );
}